

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PendingListAppendVarint(PendingList **pp,sqlite3_int64 i)

{
  int iVar1;
  sqlite_int64 in_RSI;
  undefined8 *in_RDI;
  int nNew;
  PendingList *p;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int *local_20;
  
  local_20 = (int *)*in_RDI;
  if (local_20 == (int *)0x0) {
    local_20 = (int *)sqlite3_malloc(in_stack_ffffffffffffffdc);
    if (local_20 == (int *)0x0) {
      return 7;
    }
    local_20[4] = 100;
    *(int **)(local_20 + 2) = local_20 + 0xc;
    *local_20 = 0;
  }
  else if (local_20[4] < *local_20 + 0xb) {
    iVar1 = local_20[4] << 1;
    local_20 = (int *)sqlite3_realloc((void *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),0);
    if (local_20 == (int *)0x0) {
      sqlite3_free((void *)0x1c4ec9);
      *in_RDI = 0;
      return 7;
    }
    local_20[4] = iVar1;
    *(int **)(local_20 + 2) = local_20 + 0xc;
  }
  iVar1 = sqlite3Fts3PutVarint((char *)(*(long *)(local_20 + 2) + (long)*local_20),in_RSI);
  *local_20 = iVar1 + *local_20;
  *(undefined1 *)(*(long *)(local_20 + 2) + (long)*local_20) = 0;
  *in_RDI = local_20;
  return 0;
}

Assistant:

static int fts3PendingListAppendVarint(
  PendingList **pp,               /* IN/OUT: Pointer to PendingList struct */
  sqlite3_int64 i                 /* Value to append to data */
){
  PendingList *p = *pp;

  /* Allocate or grow the PendingList as required. */
  if( !p ){
    p = sqlite3_malloc(sizeof(*p) + 100);
    if( !p ){
      return SQLITE_NOMEM;
    }
    p->nSpace = 100;
    p->aData = (char *)&p[1];
    p->nData = 0;
  }
  else if( p->nData+FTS3_VARINT_MAX+1>p->nSpace ){
    int nNew = p->nSpace * 2;
    p = sqlite3_realloc(p, sizeof(*p) + nNew);
    if( !p ){
      sqlite3_free(*pp);
      *pp = 0;
      return SQLITE_NOMEM;
    }
    p->nSpace = nNew;
    p->aData = (char *)&p[1];
  }

  /* Append the new serialized varint to the end of the list. */
  p->nData += sqlite3Fts3PutVarint(&p->aData[p->nData], i);
  p->aData[p->nData] = '\0';
  *pp = p;
  return SQLITE_OK;
}